

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.hpp
# Opt level: O0

uint32_t util::detail::byteswap(uint32_t value)

{
  uint32_t value_local;
  
  return value >> 0x18 | (value & 0xff0000) >> 8 | (value & 0xff00) << 8 | value << 0x18;
}

Assistant:

inline boost::uint32_t byteswap(boost::uint32_t value) {
#if INNOEXTRACT_HAVE_BUILTIN_BSWAP32
	return __builtin_bswap32(value);
#elif defined(_MSC_VER) && (_MSC_VER >= 1400 || (_MSC_VER >= 1300 && !defined(_DLL)))
	return _byteswap_ulong(value);
#elif INNOEXTRACT_HAVE_BSWAP_32
	return bswap_32(value);
#else
	return (boost::uint32_t(byteswap(boost::uint16_t(value))) << 16)
	       | byteswap(boost::uint16_t(value >> 16));
#endif
}